

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

owner * store_choose_owner(store *s)

{
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  void *p;
  owner *poVar4;
  bool bVar5;
  player_race *local_48;
  player_race *p_race;
  store *store;
  int *busy;
  wchar_t chance;
  wchar_t n;
  wchar_t total_prob;
  size_t i;
  owner *o;
  store *s_local;
  
  chance = L'\0';
  busy._4_4_ = 0;
  p = mem_zalloc((ulong)z_info->p_race_max << 2);
  for (_n = 0; _n < (ulong)(long)world->num_towns; _n = _n + 1) {
    p_race = (player_race *)world->towns[_n].stores;
    while( true ) {
      bVar5 = false;
      if (p_race != (player_race *)0x0) {
        bVar5 = p_race->ridx != s->sidx;
      }
      if (!bVar5) break;
      p_race = p_race->next;
    }
    if (p_race != (player_race *)0x0) {
      local_48 = races;
      while( true ) {
        bVar5 = false;
        if (p_race->dislikes != (player_race_list *)0x0) {
          bVar5 = local_48->ridx != *(uint *)(*(long *)&p_race->dislikes->rel + 0x18);
        }
        if (!bVar5) break;
        local_48 = local_48->next;
      }
      if (local_48 != (player_race *)0x0) {
        *(undefined4 *)((long)p + (ulong)local_48->ridx * 4) = 1;
      }
    }
  }
  for (_n = 0; _n < z_info->p_race_max; _n = _n + 1) {
    _Var1 = store_is_merchant(s);
    if (_Var1) {
      iVar2 = 1 - *(int *)((long)p + _n * 4);
    }
    else {
      iVar2 = race_prob[_n][s->town->index] * (1 - *(int *)((long)p + _n * 4));
    }
    chance = iVar2 + chance;
  }
  uVar3 = Rand_div(chance);
  for (_n = 0; _n < z_info->p_race_max; _n = _n + 1) {
    _Var1 = store_is_merchant(s);
    if (_Var1) {
      iVar2 = 1 - *(int *)((long)p + _n * 4);
    }
    else {
      iVar2 = race_prob[_n][s->town->index] * (1 - *(int *)((long)p + _n * 4));
    }
    busy._4_4_ = iVar2 + busy._4_4_;
    if ((int)uVar3 < busy._4_4_) break;
  }
  for (i = (size_t)s->owners; (i != 0 && (*(uint *)i != _n)); i = *(size_t *)(i + 8)) {
  }
  if (*(uint *)(*(long *)(i + 0x18) + 0x18) != _n) {
    __assert_fail("o->race->ridx == i",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                  ,0x6d9,"struct owner *store_choose_owner(struct store *)");
  }
  mem_free(p);
  poVar4 = store_ownerbyidx(s,(uint)_n);
  return poVar4;
}

Assistant:

static struct owner *store_choose_owner(struct store *s) {
	struct owner *o;
	size_t i;
	int total_prob = 0, n, chance = 0;

	/* Make array of unavailable owners */
	int *busy = mem_zalloc(z_info->p_race_max * sizeof(int));
	for (i = 0; i < (size_t) world->num_towns; i++) {
		struct store *store = world->towns[i].stores;
		while (store && (store->sidx != s->sidx)) store = store->next;
		if (store) {
			struct player_race *p_race = races;
			while (store->owner && (p_race->ridx != store->owner->race->ridx)) {
				p_race = p_race->next;
			}
			if (p_race) {
				busy[p_race->ridx] = 1;
			}
		}
	}

	/* Get the total of all the relevant "probabilities" */
	for (i = 0; i < z_info->p_race_max; i++) {
		if (store_is_merchant(s)) {
			/* Merchants are travellers, so make a completely random choice */
			total_prob += (1 - busy[i]);
		} else {
			/* Weight by race probability of reaching the town */
			total_prob += race_prob[i][s->town->index] * (1 - busy[i]);
		}
	}

	/* Pick a race, and then find it */
	n = randint0(total_prob);
	for (i = 0; i < z_info->p_race_max; i++) {
		if (store_is_merchant(s)) {
			chance += (1 - busy[i]);
		} else {
			chance += race_prob[i][s->town->index] * (1 - busy[i]);
		}
		if (chance > n) break;
	}

	/* Owner indices should correspond to race indices */
	for (o = s->owners; o; o = o->next) {
		if (o->oidx == i) break;
	}
	assert(o->race->ridx == i);

	mem_free(busy);
	return store_ownerbyidx(s, i);
}